

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O0

int __thiscall
t_program::collection_typename_count<std::vector<t_enum*,std::allocator<t_enum*>>>
          (t_program *this,t_program *prog,
          vector<t_enum_*,_std::allocator<t_enum_*>_> *type_collection,t_type *t)

{
  bool bVar1;
  int iVar2;
  reference pptVar3;
  undefined4 extraout_var;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_40;
  __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_> local_38;
  const_iterator it;
  int occurrences;
  t_type *t_local;
  vector<t_enum_*,_std::allocator<t_enum_*>_> *type_collection_local;
  t_program *prog_local;
  t_program *this_local;
  
  it._M_current._4_4_ = 0;
  local_38._M_current =
       (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::cbegin(type_collection);
  while( true ) {
    local_40._M_current =
         (t_enum **)std::vector<t_enum_*,_std::allocator<t_enum_*>_>::cend(type_collection);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
              ::operator*(&local_38);
    if ((t_enum *)t != *pptVar3) {
      iVar2 = (*(t->super_t_doc)._vptr_t_doc[3])();
      pptVar3 = __gnu_cxx::
                __normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
                ::operator*(&local_38);
      (*((*pptVar3)->super_t_type).super_t_doc._vptr_t_doc[3])();
      iVar2 = std::__cxx11::string::compare((string *)CONCAT44(extraout_var,iVar2));
      if ((iVar2 == 0) && (bVar1 = is_common_namespace(this,prog,t), bVar1)) {
        it._M_current._4_4_ = it._M_current._4_4_ + 1;
      }
    }
    __gnu_cxx::__normal_iterator<t_enum_*const_*,_std::vector<t_enum_*,_std::allocator<t_enum_*>_>_>
    ::operator++(&local_38);
  }
  return it._M_current._4_4_;
}

Assistant:

int collection_typename_count(const t_program* prog, const T type_collection, const t_type* t) const {
    int occurrences = 0;
    for (auto it = type_collection.cbegin(); it != type_collection.cend(); ++it)
      if (t != *it && 0 == t->get_name().compare((*it)->get_name()) && is_common_namespace(prog, t))
        ++occurrences;
    return occurrences;
  }